

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEExecOptions.h
# Opt level: O0

void __thiscall CEExecOptions::AddObserverPars(CEExecOptions *this)

{
  CLOptions *this_00;
  double default_val;
  CEObserver *this_01;
  CEObserver obs;
  double in_stack_fffffffffffffc88;
  string *in_stack_fffffffffffffc90;
  string *psVar1;
  string *in_stack_fffffffffffffc98;
  string *psVar2;
  CLOptions *in_stack_fffffffffffffca0;
  CEExecOptions *this_02;
  allocator local_2f1;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [39];
  undefined1 local_2a1 [40];
  undefined1 local_279 [40];
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  undefined1 local_161 [40];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [55];
  allocator local_d9;
  string local_d8 [32];
  CEObserver local_b8;
  
  CEObserver::CEObserver((CEObserver *)in_stack_fffffffffffffca0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"x,longitude",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_110,"Observer geographic longitude (degrees east positive)",&local_111);
  CLOptions::AddDoubleParam
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
             in_stack_fffffffffffffc88);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,"y,latitude",&local_139);
  this_02 = (CEExecOptions *)local_161;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_161 + 1),"Observer geographic latitude (degrees)",(allocator *)this_02
            );
  CLOptions::AddDoubleParam
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
             in_stack_fffffffffffffc88);
  std::__cxx11::string::~string((string *)(local_161 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_161);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"elevation",&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"Observer elevation (meters)",&local_1b1);
  CLOptions::AddDoubleParam
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
             in_stack_fffffffffffffc88);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"pressure",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"Observer\'s atmospheric pressure (hPa)",&local_201);
  CEObserver::Pressure_hPa(&local_b8);
  CLOptions::AddDoubleParam
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
             in_stack_fffffffffffffc88);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"humidity",&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"Observer\'s atmospheric humicity (0-1)",&local_251);
  this_00 = (CLOptions *)CEObserver::RelativeHumidity(&local_b8);
  CLOptions::AddDoubleParam
            (this_00,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  psVar2 = (string *)local_279;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_279 + 1),"temperature",(allocator *)psVar2);
  psVar1 = (string *)local_2a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_2a1 + 1),"Observer\'s atmospheric temperature (Celsius)",
             (allocator *)psVar1);
  default_val = CEObserver::Temperature_C(&local_b8);
  CLOptions::AddDoubleParam(this_00,psVar2,psVar1,default_val);
  std::__cxx11::string::~string((string *)(local_2a1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2a1);
  std::__cxx11::string::~string((string *)(local_279 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"wavelength",&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"Observing wavelength (micrometers)",&local_2f1);
  this_01 = (CEObserver *)CEObserver::Wavelength_um(&local_b8);
  CLOptions::AddDoubleParam(this_00,psVar2,psVar1,default_val);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  AddJDPar(this_02);
  CEObserver::~CEObserver(this_01);
  return;
}

Assistant:

inline
void CEExecOptions::AddObserverPars(void)
{
    CEObserver obs;
    AddDoubleParam("x,longitude", "Observer geographic longitude (degrees east positive)", 0.0);
    AddDoubleParam("y,latitude", "Observer geographic latitude (degrees)", 0.0);
    AddDoubleParam("elevation", "Observer elevation (meters)", 0.0);
    AddDoubleParam("pressure", "Observer's atmospheric pressure (hPa)", obs.Pressure_hPa());
    AddDoubleParam("humidity", "Observer's atmospheric humicity (0-1)", obs.RelativeHumidity());
    AddDoubleParam("temperature", "Observer's atmospheric temperature (Celsius)", obs.Temperature_C());
    AddDoubleParam("wavelength", "Observing wavelength (micrometers)", obs.Wavelength_um());

    // Add date parameter
    AddJDPar();
}